

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int read_PackInfo(archive_read *a,_7z_pack_info *pi)

{
  int iVar1;
  uchar *puVar2;
  uint64_t *puVar3;
  uint32_t *puVar4;
  uint local_2c;
  uint i;
  uchar *p;
  _7z_pack_info *pi_local;
  archive_read *a_local;
  
  memset(pi,0,0x30);
  iVar1 = parse_7zip_uint64(a,&pi->pos);
  if (iVar1 < 0) {
    a_local._4_4_ = -1;
  }
  else {
    iVar1 = parse_7zip_uint64(a,&pi->numPackStreams);
    if (iVar1 < 0) {
      a_local._4_4_ = -1;
    }
    else if (pi->numPackStreams == 0) {
      a_local._4_4_ = -1;
    }
    else if (pi->numPackStreams < 0x5f5e101) {
      puVar2 = header_bytes(a,1);
      if (puVar2 == (uchar *)0x0) {
        a_local._4_4_ = -1;
      }
      else if (*puVar2 == '\0') {
        a_local._4_4_ = 0;
      }
      else if (*puVar2 == '\t') {
        puVar3 = (uint64_t *)calloc(pi->numPackStreams,8);
        pi->sizes = puVar3;
        puVar3 = (uint64_t *)calloc(pi->numPackStreams,8);
        pi->positions = puVar3;
        if ((pi->sizes == (uint64_t *)0x0) || (pi->positions == (uint64_t *)0x0)) {
          a_local._4_4_ = -1;
        }
        else {
          for (local_2c = 0; (ulong)local_2c < pi->numPackStreams; local_2c = local_2c + 1) {
            iVar1 = parse_7zip_uint64(a,pi->sizes + local_2c);
            if (iVar1 < 0) {
              return -1;
            }
          }
          puVar2 = header_bytes(a,1);
          if (puVar2 == (uchar *)0x0) {
            a_local._4_4_ = -1;
          }
          else if (*puVar2 == '\0') {
            puVar2 = (uchar *)calloc(pi->numPackStreams,1);
            (pi->digest).defineds = puVar2;
            puVar4 = (uint32_t *)calloc(pi->numPackStreams,4);
            (pi->digest).digests = puVar4;
            if (((pi->digest).defineds == (uchar *)0x0) || ((pi->digest).digests == (uint32_t *)0x0)
               ) {
              a_local._4_4_ = -1;
            }
            else {
              a_local._4_4_ = 0;
            }
          }
          else if (*puVar2 == '\t') {
            iVar1 = read_Digests(a,&pi->digest,pi->numPackStreams);
            if (iVar1 < 0) {
              a_local._4_4_ = -1;
            }
            else {
              puVar2 = header_bytes(a,1);
              if (puVar2 == (uchar *)0x0) {
                a_local._4_4_ = -1;
              }
              else if (*puVar2 == '\0') {
                a_local._4_4_ = 0;
              }
              else {
                a_local._4_4_ = -1;
              }
            }
          }
          else {
            a_local._4_4_ = -1;
          }
        }
      }
      else {
        a_local._4_4_ = -1;
      }
    }
    else {
      a_local._4_4_ = -1;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
read_PackInfo(struct archive_read *a, struct _7z_pack_info *pi)
{
	const unsigned char *p;
	unsigned i;

	memset(pi, 0, sizeof(*pi));

	/*
	 * Read PackPos.
	 */
	if (parse_7zip_uint64(a, &(pi->pos)) < 0)
		return (-1);

	/*
	 * Read NumPackStreams.
	 */
	if (parse_7zip_uint64(a, &(pi->numPackStreams)) < 0)
		return (-1);
	if (pi->numPackStreams == 0)
		return (-1);
	if (UMAX_ENTRY < pi->numPackStreams)
		return (-1);

	/*
	 * Read PackSizes[num]
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kEnd)
		/* PackSizes[num] are not present. */
		return (0);
	if (*p != kSize)
		return (-1);
	pi->sizes = calloc((size_t)pi->numPackStreams, sizeof(uint64_t));
	pi->positions = calloc((size_t)pi->numPackStreams, sizeof(uint64_t));
	if (pi->sizes == NULL || pi->positions == NULL)
		return (-1);

	for (i = 0; i < pi->numPackStreams; i++) {
		if (parse_7zip_uint64(a, &(pi->sizes[i])) < 0)
			return (-1);
	}

	/*
	 * Read PackStreamDigests[num]
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kEnd) {
		/* PackStreamDigests[num] are not present. */
		pi->digest.defineds =
		    calloc((size_t)pi->numPackStreams, sizeof(*pi->digest.defineds));
		pi->digest.digests =
		    calloc((size_t)pi->numPackStreams, sizeof(*pi->digest.digests));
		if (pi->digest.defineds == NULL || pi->digest.digests == NULL)
			return (-1);
		return (0);
	}

	if (*p != kSize)
		return (-1);

	if (read_Digests(a, &(pi->digest), (size_t)pi->numPackStreams) < 0)
		return (-1);

	/*
	 *  Must be marked by kEnd.
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p != kEnd)
		return (-1);
	return (0);
}